

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t tag,wchar_t *wname,wchar_t perm,wchar_t id)

{
  wchar_t wVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  wchar_t *pwVar5;
  int *__src;
  wchar_t *pwVar6;
  ulong uVar7;
  
  if (prefix != (wchar_t *)0x0) {
    wcscpy(*wp,prefix);
    pwVar6 = *wp;
    sVar4 = wcslen(pwVar6);
    *wp = pwVar6 + sVar4;
  }
  __src = anon_var_dwarf_8e7554;
  switch(tag) {
  case L'✒':
    break;
  case L'✓':
    __src = anon_var_dwarf_8e756b;
  case L'✑':
    goto LAB_003fc33a;
  case L'✔':
    __src = anon_var_dwarf_8e756b;
    break;
  case L'✕':
    __src = anon_var_dwarf_8e758d;
    break;
  case L'✖':
    __src = anon_var_dwarf_8e7582;
    break;
  default:
    goto switchD_003fc310_default;
  }
  wname = (wchar_t *)0x0;
  id = L'\xffffffff';
LAB_003fc33a:
  wcscpy(*wp,__src);
switchD_003fc310_default:
  pwVar6 = *wp;
  sVar4 = wcslen(pwVar6);
  pwVar6 = pwVar6 + sVar4 + 1;
  *wp = pwVar6;
  pwVar6[-1] = L':';
  if (wname == (wchar_t *)0x0) {
    if ((tag & 0xfffffffdU) == 0x2711) {
      append_id_w(wp,id);
      pwVar6 = *wp;
      id = L'\xffffffff';
    }
  }
  else {
    wcscpy(pwVar6,wname);
    pwVar6 = *wp;
    sVar4 = wcslen(pwVar6);
    pwVar6 = pwVar6 + sVar4;
  }
  uVar7 = CONCAT44(-(uint)((perm & 0x92U) == 0),-(uint)((perm & 0x124U) == 0));
  uVar3 = (ulong)DAT_0049b050;
  uVar2 = (ulong)DAT_0049b060;
  *pwVar6 = L':';
  *(ulong *)(pwVar6 + 1) = uVar7 & uVar2 | ~uVar7 & uVar3;
  wVar1 = L'x';
  if ((perm & 0x49U) == 0) {
    wVar1 = L'-';
  }
  pwVar5 = pwVar6 + 4;
  *wp = pwVar5;
  pwVar6[3] = wVar1;
  if (id != L'\xffffffff') {
    *wp = pwVar6 + 5;
    pwVar6[4] = L':';
    append_id_w(wp,id);
    pwVar5 = *wp;
  }
  *pwVar5 = L'\0';
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int tag,
    const wchar_t *wname, int perm, int id)
{
	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (wname != NULL) {
		wcscpy(*wp, wname);
		*wp += wcslen(*wp);
	} else if (tag == ARCHIVE_ENTRY_ACL_USER
	    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
		append_id_w(wp, id);
		id = -1;
	}
	*(*wp)++ = L':';
	*(*wp)++ = (perm & 0444) ? L'r' : L'-';
	*(*wp)++ = (perm & 0222) ? L'w' : L'-';
	*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
	**wp = L'\0';
}